

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall WriterTest_WriteChar_Test::TestBody(WriterTest_WriteChar_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  AssertionResult *pAVar6;
  undefined8 uVar7;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a20;
  char *local_a00;
  AssertionResult local_9f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9e8;
  AssertionResult local_9c8;
  wchar_t local_9b8;
  undefined4 uStack_9b4;
  undefined1 local_9a8 [16];
  AssertionResult local_998 [7];
  ios_base local_928 [128];
  long alStack_8a8 [17];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_820;
  undefined4 *local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined4 local_800;
  undefined1 auStack_7fc [1996];
  
  uStack_810 = 1;
  local_808 = 500;
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_a00 = "char";
  local_800 = CONCAT31(local_800._1_3_,0x61);
  paVar1 = &local_9e8.field_2;
  local_9e8._M_dataplus._M_p = (pointer)paVar1;
  local_818 = &local_800;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9e8,&local_800,(long)&local_800 + 1);
  paVar2 = &local_a20.field_2;
  local_a20._M_string_length = 0;
  local_a20.field_2._M_local_buf[0] = local_a20.field_2._M_local_buf[0] & 0xffffff00;
  local_a20._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  local_9b8 = CONCAT31(local_9b8._1_3_,0x61);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,(char *)&local_9b8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a20,(string *)&local_9b8);
  if ((undefined1 *)CONCAT44(uStack_9b4,local_9b8) != local_9a8) {
    operator_delete((undefined1 *)CONCAT44(uStack_9b4,local_9b8));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  std::ios_base::~ios_base(local_928);
  if ((local_a20._M_string_length == local_9e8._M_string_length) &&
     ((local_a20._M_string_length == 0 ||
      (iVar5 = bcmp(local_a20._M_dataplus._M_p,local_9e8._M_dataplus._M_p,local_a20._M_string_length
                   ), iVar5 == 0)))) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar6 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_a00);
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [21])">() << value).str()\n");
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x250069);
    pAVar6 = testing::AssertionResult::operator<<
                       (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_9e8);
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x250738);
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x250075);
    pAVar6 = testing::AssertionResult::operator<<
                       (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a20);
    pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x250738);
    testing::AssertionResult::AssertionResult(&local_9c8,pAVar6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_998[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a20._M_dataplus._M_p != paVar2) {
    operator_delete(local_a20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9e8._M_dataplus._M_p);
  }
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_818 != &local_800) {
    operator_delete(local_818);
  }
  if (local_9c8.success_ == true) {
    uStack_810 = 1;
    local_808 = 500;
    local_820.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &PTR_grow_002a8d18;
    local_a00 = "wchar_t";
    local_800 = 0x61;
    local_9e8._M_dataplus._M_p = (pointer)paVar1;
    local_818 = &local_800;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_9e8,&local_800,auStack_7fc);
    local_a20._M_string_length = 0;
    local_a20.field_2._M_local_buf[0] = L'\0';
    local_a20._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_998);
    plVar3 = *(long **)((long)alStack_8a8 + *(long *)(local_998[0]._0_8_ + -0x18));
    if (plVar3 == (long *)0x0) {
      uVar7 = std::__throw_bad_cast();
      local_820.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8d18;
      if (local_818 != &local_800) {
        operator_delete(local_818);
      }
      testing::AssertionResult::~AssertionResult(&local_9c8);
      _Unwind_Resume(uVar7);
    }
    local_9b8 = (**(code **)(*plVar3 + 0x50))(plVar3,0x61);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_998,&local_9b8,1);
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wstring::operator=((wstring *)&local_a20,(wstring *)&local_9b8);
    if ((undefined1 *)CONCAT44(uStack_9b4,local_9b8) != local_9a8) {
      operator_delete((undefined1 *)CONCAT44(uStack_9b4,local_9b8));
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_998);
    std::ios_base::~ios_base(local_928);
    if ((local_a20._M_string_length == local_9e8._M_string_length) &&
       ((local_a20._M_string_length == 0 ||
        (iVar5 = wmemcmp(local_a20._M_dataplus._M_p,local_9e8._M_dataplus._M_p,
                         local_a20._M_string_length), iVar5 == 0)))) {
      testing::AssertionSuccess();
    }
    else {
      testing::AssertionFailure();
      pAVar6 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_a00);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [21])">() << value).str()\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x250069);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_9e8);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x250738);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x250075);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_a20);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x250738);
      testing::AssertionResult::AssertionResult(&local_9f8,pAVar6);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_998[0].message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_a20._M_dataplus._M_p != paVar2) {
      operator_delete(local_a20._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_9e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_9e8._M_dataplus._M_p);
    }
    local_820.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &PTR_grow_002a8d18;
    if (local_818 != &local_800) {
      operator_delete(local_818);
    }
  }
  else {
    testing::AssertionResult::AssertionResult(&local_9f8,&local_9c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_9f8.success_ == false) {
    testing::Message::Message((Message *)&local_820);
    if (local_9f8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_9f8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2aa,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_998,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_998);
    if (local_820.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_820.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_820.ptr_ + 8))();
      }
      local_820.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9f8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(WriterTest, WriteChar) {
  CHECK_WRITE('a');
}